

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O1

void check_handling(display *d,int def,png_uint_32 chunks,png_uint_32 known,png_uint_32 unknown,
                   char *position,int set_callback)

{
  anon_struct_32_7_46fe1f00 *paVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uint flag;
  bool bVar7;
  
  if (chunks != 0) {
    pcVar4 = ",callback";
    if (set_callback == 0) {
      pcVar4 = "";
    }
    do {
      flag = -chunks & chunks;
      uVar3 = find_by_flag(flag);
      paVar1 = chunk_info + uVar3;
      iVar2 = chunk_info[uVar3].keep;
      if (chunk_info[uVar3].unknown == 0) {
        if ((flag & known) != 0) {
          bVar7 = iVar2 == 0;
          pcVar6 = "!DEFAULT: known chunk processed";
          goto LAB_00103536;
        }
        switch(iVar2) {
        case 0:
          bVar7 = false;
          pcVar5 = "KNOWN";
          pcVar6 = "DEFAULT: known chunk not processed";
          break;
        case 1:
          bVar7 = (unknown & flag) == 0;
          pcVar6 = "DISCARD: known chunk saved";
          goto LAB_00103536;
        case 2:
          if (((uint)((int)chunk_info[uVar3].name[3] + chunk_info[uVar3].name[2] * 0x100 +
                     chunk_info[uVar3].name[1] * 0x10000 + *(int *)paVar1->name * 0x1000000) >> 0x1d
              & 1) != 0) {
            pcVar6 = "IF-SAFE: known ancillary chunk lost";
            goto LAB_00103728;
          }
          bVar7 = (unknown & flag) == 0;
          pcVar6 = "IF-SAFE: known critical chunk saved";
LAB_00103536:
          if (bVar7) {
            pcVar6 = (char *)0x0;
          }
LAB_0010353f:
          pcVar5 = "KNOWN";
          break;
        case 3:
          pcVar6 = "SAVE: known chunk lost";
LAB_00103728:
          bVar7 = (unknown & flag) != 0;
          if (bVar7) {
            pcVar6 = (char *)0x0;
          }
          goto LAB_0010353f;
        default:
          bVar7 = false;
          pcVar5 = "KNOWN";
          pcVar6 = "internal error: bad keep (2)";
        }
        goto LAB_001036bb;
      }
      pcVar5 = "UNKNOWN (specified)";
      if (iVar2 == 0) {
        pcVar5 = "UNKNOWN (default)";
      }
      if ((flag & known) != 0) {
        bVar7 = false;
        pcVar6 = "chunk processed";
        goto LAB_001036bb;
      }
      if (iVar2 == 0) {
        iVar2 = def;
      }
      switch(iVar2) {
      case 0:
        bVar7 = (unknown & flag) == 0;
        pcVar6 = "DEFAULT: unknown chunk saved";
        break;
      case 1:
        bVar7 = (unknown & flag) == 0;
        pcVar6 = "DISCARD: unknown chunk saved";
        break;
      case 2:
        if (((uint)((int)chunk_info[uVar3].name[3] + chunk_info[uVar3].name[2] * 0x100 +
                   chunk_info[uVar3].name[1] * 0x10000 + *(int *)paVar1->name * 0x1000000) >> 0x1d &
            1) != 0) {
          pcVar6 = "IF-SAFE: unknown ancillary chunk lost";
          goto LAB_001036b2;
        }
        bVar7 = (unknown & flag) == 0;
        pcVar6 = "IF-SAFE: unknown critical chunk saved";
        break;
      case 3:
        pcVar6 = "SAVE: unknown chunk lost";
LAB_001036b2:
        bVar7 = (unknown & flag) != 0;
        if (bVar7) {
          pcVar6 = (char *)0x0;
        }
        goto LAB_001036bb;
      default:
        bVar7 = false;
        pcVar6 = "internal error: bad keep";
        goto LAB_001036bb;
      }
      if (bVar7) {
        pcVar6 = (char *)0x0;
      }
LAB_001036bb:
      if (!bVar7) {
        d->error_count = d->error_count + 1;
        fprintf(_stderr,"%s(%s%s): %s %s %s: %s\n",d->file,d->test,pcVar4,pcVar5,paVar1,position,
                pcVar6);
      }
      bVar7 = flag != chunks;
      chunks = flag ^ chunks;
    } while (bVar7);
  }
  return;
}

Assistant:

static void
check_handling(display *d, int def, png_uint_32 chunks, png_uint_32 known,
   png_uint_32 unknown, const char *position, int set_callback)
{
   while (chunks)
   {
      png_uint_32 flag = chunks & -(png_int_32)chunks;
      int i = find_by_flag(flag);
      int keep = chunk_info[i].keep;
      const char *type;
      const char *errorx = NULL;

      if (chunk_info[i].unknown)
      {
         if (keep == PNG_HANDLE_CHUNK_AS_DEFAULT)
         {
            type = "UNKNOWN (default)";
            keep = def;
         }

         else
            type = "UNKNOWN (specified)";

         if (flag & known)
            errorx = "chunk processed";

         else switch (keep)
         {
            case PNG_HANDLE_CHUNK_AS_DEFAULT:
               if (flag & unknown)
                  errorx = "DEFAULT: unknown chunk saved";
               break;

            case PNG_HANDLE_CHUNK_NEVER:
               if (flag & unknown)
                  errorx = "DISCARD: unknown chunk saved";
               break;

            case PNG_HANDLE_CHUNK_IF_SAFE:
               if (ancillary(chunk_info[i].name))
               {
                  if (!(flag & unknown))
                     errorx = "IF-SAFE: unknown ancillary chunk lost";
               }

               else if (flag & unknown)
                  errorx = "IF-SAFE: unknown critical chunk saved";
               break;

            case PNG_HANDLE_CHUNK_ALWAYS:
               if (!(flag & unknown))
                  errorx = "SAVE: unknown chunk lost";
               break;

            default:
               errorx = "internal error: bad keep";
               break;
         }
      } /* unknown chunk */

      else /* known chunk */
      {
         type = "KNOWN";

         if (flag & known)
         {
            /* chunk was processed, it won't have been saved because that is
             * caught below when checking for inconsistent processing.
             */
            if (keep != PNG_HANDLE_CHUNK_AS_DEFAULT)
               errorx = "!DEFAULT: known chunk processed";
         }

         else /* not processed */ switch (keep)
         {
            case PNG_HANDLE_CHUNK_AS_DEFAULT:
               errorx = "DEFAULT: known chunk not processed";
               break;

            case PNG_HANDLE_CHUNK_NEVER:
               if (flag & unknown)
                  errorx = "DISCARD: known chunk saved";
               break;

            case PNG_HANDLE_CHUNK_IF_SAFE:
               if (ancillary(chunk_info[i].name))
               {
                  if (!(flag & unknown))
                     errorx = "IF-SAFE: known ancillary chunk lost";
               }

               else if (flag & unknown)
                  errorx = "IF-SAFE: known critical chunk saved";
               break;

            case PNG_HANDLE_CHUNK_ALWAYS:
               if (!(flag & unknown))
                  errorx = "SAVE: known chunk lost";
               break;

            default:
               errorx = "internal error: bad keep (2)";
               break;
         }
      }

      if (errorx != NULL)
      {
         ++(d->error_count);
         fprintf(stderr, "%s(%s%s): %s %s %s: %s\n", d->file, d->test,
            set_callback ? ",callback" : "",
            type, chunk_info[i].name, position, errorx);
      }

      chunks &= ~flag;
   }
}